

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

void die_on_amqp_error(amqp_rpc_reply_t x,char *context)

{
  FILE *__stream;
  undefined8 uVar1;
  undefined8 in_RDI;
  undefined4 in_stack_00000008;
  uint in_stack_00000010;
  ushort *in_stack_00000018;
  undefined4 in_stack_00000020;
  amqp_channel_close_t *m_1;
  amqp_connection_close_t *m;
  
  __stream = _stderr;
  switch(in_stack_00000008) {
  case 0:
    fprintf(_stderr,"%s: missing RPC reply type!\n",in_RDI);
    break;
  case 1:
    return;
  case 2:
    uVar1 = amqp_error_string2(in_stack_00000020);
    fprintf(__stream,"%s: %s\n",in_RDI,uVar1);
    break;
  case 3:
    if (in_stack_00000010 == 0xa0032) {
      fprintf(_stderr,"%s: server connection error %d, message: %.*s\n",in_RDI,
              (ulong)*in_stack_00000018,*(ulong *)(in_stack_00000018 + 4) & 0xffffffff,
              *(undefined8 *)(in_stack_00000018 + 8));
    }
    else if (in_stack_00000010 == 0x140028) {
      fprintf(_stderr,"%s: server channel error %d, message: %.*s\n",in_RDI,
              (ulong)*in_stack_00000018,*(ulong *)(in_stack_00000018 + 4) & 0xffffffff,
              *(undefined8 *)(in_stack_00000018 + 8));
    }
    else {
      fprintf(_stderr,"%s: unknown server error, method id 0x%08X\n",in_RDI,(ulong)in_stack_00000010
             );
    }
  }
  exit(1);
}

Assistant:

void die_on_amqp_error(amqp_rpc_reply_t x, char const *context)
{
  switch (x.reply_type) {
  case AMQP_RESPONSE_NORMAL:
    return;

  case AMQP_RESPONSE_NONE:
    fprintf(stderr, "%s: missing RPC reply type!\n", context);
    break;

  case AMQP_RESPONSE_LIBRARY_EXCEPTION:
    fprintf(stderr, "%s: %s\n", context, amqp_error_string2(x.library_error));
    break;

  case AMQP_RESPONSE_SERVER_EXCEPTION:
    switch (x.reply.id) {
    case AMQP_CONNECTION_CLOSE_METHOD: {
      amqp_connection_close_t *m = (amqp_connection_close_t *) x.reply.decoded;
      fprintf(stderr, "%s: server connection error %d, message: %.*s\n",
              context,
              m->reply_code,
              (int) m->reply_text.len, (char *) m->reply_text.bytes);
      break;
    }
    case AMQP_CHANNEL_CLOSE_METHOD: {
      amqp_channel_close_t *m = (amqp_channel_close_t *) x.reply.decoded;
      fprintf(stderr, "%s: server channel error %d, message: %.*s\n",
              context,
              m->reply_code,
              (int) m->reply_text.len, (char *) m->reply_text.bytes);
      break;
    }
    default:
      fprintf(stderr, "%s: unknown server error, method id 0x%08X\n", context, x.reply.id);
      break;
    }
    break;
  }

  exit(1);
}